

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O2

size_t chrono::utils::ChValidation::ReadDataFile
                 (string *filename,char delim,Headers *headers,Data *data)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  difference_type dVar1;
  istream *piVar2;
  size_type __new_size;
  size_t sVar3;
  size_type sVar4;
  long lVar5;
  bool bVar6;
  undefined8 in_stack_fffffffffffffa68;
  _Iter_equals_val<const_char> in_stack_fffffffffffffa70;
  string line;
  string col_header;
  ifstream ifile;
  stringstream iss1;
  stringstream iss;
  
  std::ifstream::ifstream(&ifile,(filename->_M_dataplus)._M_p,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iss1 = (stringstream)0xa;
  __first._8_8_ = in_stack_fffffffffffffa68;
  __first._M_sbuf = (streambuf_type *)0xe402d6;
  __last._8_8_ = 0;
  __last._M_sbuf = (streambuf_type *)line._M_dataplus._M_p;
  dVar1 = std::
          __count_if<std::istreambuf_iterator<char,std::char_traits<char>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,__last,in_stack_fffffffffffffa70);
  std::istream::seekg((long)&ifile,_S_beg);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifile,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifile,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifile,(string *)&line);
  std::__cxx11::stringstream::stringstream((stringstream *)&iss1,(string *)&line,_S_out|_S_in);
  std::__cxx11::string::string((string *)&col_header,"",(allocator *)&iss);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss1,(string *)&col_header,delim);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(headers,&col_header);
  }
  __new_size = (long)(headers->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(headers->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  std::vector<std::valarray<double>,_std::allocator<std::valarray<double>_>_>::resize
            (data,__new_size);
  lVar5 = 0;
  sVar4 = __new_size;
  while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
    std::valarray<double>::resize
              ((valarray<double> *)
               ((long)&((data->
                        super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar5),dVar1 - 3,0.0)
    ;
    lVar5 = lVar5 + 0x10;
  }
  sVar3 = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifile,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream((stringstream *)&iss,(string *)&line,_S_out|_S_in);
    sVar4 = __new_size;
    while (bVar6 = __new_size != 0, __new_size = __new_size - 1, bVar6) {
      std::istream::_M_extract<double>((double *)&iss);
    }
    sVar3 = sVar3 + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&iss);
    __new_size = sVar4;
  }
  std::__cxx11::string::~string((string *)&col_header);
  std::__cxx11::stringstream::~stringstream((stringstream *)&iss1);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ifile);
  return sVar3;
}

Assistant:

size_t ChValidation::ReadDataFile(const std::string& filename,
                                  char               delim,
                                  Headers&           headers,
                                  Data&              data)
{
  std::ifstream ifile(filename.c_str());
  std::string   line;

  // Count the number of lines in the file then rewind the input file stream.
  size_t num_lines = std::count(std::istreambuf_iterator<char>(ifile),
                                std::istreambuf_iterator<char>(), '\n');
  ifile.seekg(0, ifile.beg);

  size_t num_data_points = num_lines - 3;

  // Skip the first two lines.
  std::getline(ifile, line);
  std::getline(ifile, line);

  // Read the line with column headers.
  std::getline(ifile, line);
  std::stringstream iss1(line);
  std::string col_header = "";

  while (std::getline(iss1, col_header, delim))
    headers.push_back(col_header);

  size_t num_cols = headers.size();

  // Resize data
  data.resize(num_cols);
  for (size_t col = 0; col < num_cols; col++)
    data[col].resize(num_data_points);

  // Read the actual data, one line at a time.
  size_t row = 0;
  while (std::getline(ifile, line)) {
    std::stringstream iss(line);
    for (size_t col = 0; col < num_cols; col++)
      iss >> data[col][row];
    row++;
  }

  return row;
}